

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglframebufferobject.cpp
# Opt level: O3

void __thiscall QOpenGLFramebufferObject::~QOpenGLFramebufferObject(QOpenGLFramebufferObject *this)

{
  QOpenGLFramebufferObjectPrivate *pQVar1;
  void *pvVar2;
  undefined1 *puVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  
  this->_vptr_QOpenGLFramebufferObject = (_func_int **)&PTR__QOpenGLFramebufferObject_001a0da8;
  pQVar1 = (this->d_ptr).d;
  bVar4 = isBound(this);
  if (bVar4) {
    release(this);
  }
  lVar5 = (pQVar1->colorAttachments).
          super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.super_QVLABaseBase.s;
  if (lVar5 != 0) {
    pvVar2 = (pQVar1->colorAttachments).
             super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.super_QVLABaseBase.ptr
    ;
    lVar6 = 0;
    do {
      if (*(long *)((long)pvVar2 + lVar6 + 0x10) != 0) {
        QOpenGLSharedResource::free();
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar5 * 0x18 != lVar6);
  }
  (pQVar1->colorAttachments).super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.
  super_QVLABaseBase.s = 0;
  if (pQVar1->depth_buffer_guard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  if ((pQVar1->stencil_buffer_guard != (QOpenGLSharedResourceGuard *)0x0) &&
     (pQVar1->stencil_buffer_guard != pQVar1->depth_buffer_guard)) {
    QOpenGLSharedResource::free();
  }
  if (pQVar1->fbo_guard != (QOpenGLSharedResourceGuard *)0x0) {
    QOpenGLSharedResource::free();
  }
  lVar5 = QOpenGLContext::currentContext();
  if (((lVar5 != 0) && (lVar5 = *(long *)(lVar5 + 8), lVar5 != 0)) &&
     (*(QOpenGLFramebufferObject **)(lVar5 + 0x110) == this)) {
    *(undefined1 *)(lVar5 + 0x108) = 1;
    *(undefined8 *)(lVar5 + 0x110) = 0;
  }
  pQVar1 = (this->d_ptr).d;
  if (pQVar1 != (QOpenGLFramebufferObjectPrivate *)0x0) {
    puVar3 = (undefined1 *)
             (pQVar1->colorAttachments).
             super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.super_QVLABaseBase.ptr
    ;
    if ((QVLAStorage<24UL,_8UL,_8LL> *)puVar3 !=
        &(pQVar1->colorAttachments).super_QVLAStorage<24UL,_8UL,_8LL>) {
      QtPrivate::sizedFree
                (puVar3,(pQVar1->colorAttachments).
                        super_QVLABase<QOpenGLFramebufferObjectPrivate::ColorAttachment>.
                        super_QVLABaseBase.a * 0x18);
    }
    QOpenGLFramebufferObjectFormat::~QOpenGLFramebufferObjectFormat(&pQVar1->format);
  }
  operator_delete(pQVar1,0x120);
  return;
}

Assistant:

QOpenGLFramebufferObject::~QOpenGLFramebufferObject()
{
    Q_D(QOpenGLFramebufferObject);
    if (isBound())
        release();

    for (const auto &color : std::as_const(d->colorAttachments)) {
        if (color.guard)
            color.guard->free();
    }
    d->colorAttachments.clear();

    if (d->depth_buffer_guard)
        d->depth_buffer_guard->free();
    if (d->stencil_buffer_guard && d->stencil_buffer_guard != d->depth_buffer_guard)
        d->stencil_buffer_guard->free();
    if (d->fbo_guard)
        d->fbo_guard->free();

    QOpenGLContextPrivate *contextPrv = QOpenGLContextPrivate::get(QOpenGLContext::currentContext());
    if (contextPrv && contextPrv->qgl_current_fbo == this) {
        contextPrv->qgl_current_fbo_invalid = true;
        contextPrv->qgl_current_fbo = nullptr;
    }
}